

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginElemSegmentInitExpr(BinaryReaderIR *this,Index index)

{
  Result RVar1;
  size_type sVar2;
  reference ppEVar3;
  ElemSegment *segment;
  Index index_local;
  BinaryReaderIR *this_local;
  
  sVar2 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::size
                    (&this->module_->elem_segments);
  if ((ulong)index == sVar2 - 1) {
    ppEVar3 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::operator[]
                        (&this->module_->elem_segments,(ulong)index);
    RVar1 = BeginInitExpr(this,&(*ppEVar3)->offset);
    return (Result)RVar1.enum_;
  }
  __assert_fail("index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                ,0x4fa,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginElemSegmentInitExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginElemSegmentInitExpr(Index index) {
  assert(index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[index];
  return BeginInitExpr(&segment->offset);
}